

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O2

boolean water_prayer(boolean bless_water)

{
  uint uVar1;
  obj *poVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  boolean bVar6;
  vptrs *pvVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00217c79;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00217c74;
LAB_00217c9f:
    uVar9 = 0x40;
    if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
      if (u.umonnum == u.umonster) goto LAB_00217cca;
      bVar6 = dmgtype(youmonst.data,0x24);
      uVar9 = (uint)(bVar6 != '\0') << 6;
    }
  }
  else {
LAB_00217c74:
    if (ublindf != (obj *)0x0) {
LAB_00217c79:
      if (ublindf->oartifact == '\x1d') goto LAB_00217c9f;
    }
LAB_00217cca:
    uVar9 = 0;
  }
  lVar10 = 0;
  bVar5 = false;
  pvVar7 = (vptrs *)(level->objects[u.ux] + u.uy);
  while (poVar2 = pvVar7->v_nexthere, poVar2 != (obj *)0x0) {
    if (poVar2->otyp == 0x14f) {
      uVar1 = *(uint *)&poVar2->field_0x4a;
      if (bless_water == '\0') {
        uVar3 = uVar1 & 1;
      }
      else {
        uVar3 = uVar1 & 2;
      }
      if (uVar3 != 0) goto LAB_00217d3f;
      *(uint *)&poVar2->field_0x4a =
           uVar1 & 0xffffffbc | (bless_water * '\x02' & 2U | bless_water == '\0') | uVar9;
      lVar10 = lVar10 + poVar2->quan;
    }
    else {
LAB_00217d3f:
      if (poVar2->oclass == '\b') {
        bVar5 = true;
      }
    }
    pvVar7 = &poVar2->v;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00217d65;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00217d5c;
  }
  else {
LAB_00217d5c:
    if (ublindf == (obj *)0x0) goto LAB_00217e06;
LAB_00217d65:
    if (ublindf->oartifact != '\x1d') goto LAB_00217e06;
  }
  if (lVar10 != 0) {
    pcVar8 = "One of the";
    if (1 < lVar10) {
      pcVar8 = "Some of the";
    }
    pcVar11 = "";
    pcVar12 = "";
    if (lVar10 < 2) {
      pcVar11 = "s";
    }
    else {
      pcVar12 = "s";
    }
    pcVar4 = "The";
    if (bVar5) {
      pcVar12 = "s";
      pcVar4 = pcVar8;
    }
    pcVar8 = "light blue";
    if (bless_water == '\0') {
      pcVar8 = "black";
    }
    pcVar8 = hcolor(pcVar8);
    pline("%s potion%s on the altar glow%s %s for a moment.",pcVar4,pcVar12,pcVar11,pcVar8);
  }
LAB_00217e06:
  return 0 < lVar10;
}

Assistant:

static boolean water_prayer(boolean bless_water)
{
    struct obj* otmp;
    long changed = 0;
    boolean other = FALSE, bc_known = !(Blind || Hallucination);

    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
	/* turn water into (un)holy water */
	if (otmp->otyp == POT_WATER &&
		(bless_water ? !otmp->blessed : !otmp->cursed)) {
	    otmp->blessed = bless_water;
	    otmp->cursed = !bless_water;
	    otmp->bknown = bc_known;
	    changed += otmp->quan;
	} else if (otmp->oclass == POTION_CLASS)
	    other = TRUE;
    }
    if (!Blind && changed) {
	pline("%s potion%s on the altar glow%s %s for a moment.",
	      ((other && changed > 1L) ? "Some of the" :
					(other ? "One of the" : "The")),
	      ((other || changed > 1L) ? "s" : ""), (changed > 1L ? "" : "s"),
	      (bless_water ? hcolor("light blue") : hcolor("black")));
    }
    return (boolean)(changed > 0L);
}